

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_sine.c
# Opt level: O0

int patestCallback(void *inputBuffer,void *outputBuffer,unsigned_long framesPerBuffer,
                  PaStreamCallbackTimeInfo *timeInfo,PaStreamCallbackFlags statusFlags,
                  void *userData)

{
  undefined4 *puVar1;
  undefined8 local_50;
  unsigned_long i;
  float *out;
  paTestData *data;
  void *userData_local;
  PaStreamCallbackFlags statusFlags_local;
  PaStreamCallbackTimeInfo *timeInfo_local;
  unsigned_long framesPerBuffer_local;
  void *outputBuffer_local;
  void *inputBuffer_local;
  
  i = (unsigned_long)outputBuffer;
  for (local_50 = 0; local_50 < framesPerBuffer; local_50 = local_50 + 1) {
    puVar1 = (undefined4 *)(i + 4);
    *(undefined4 *)i = *(undefined4 *)((long)userData + (long)*(int *)((long)userData + 800) * 4);
    i = i + 8;
    *puVar1 = *(undefined4 *)((long)userData + (long)*(int *)((long)userData + 0x324) * 4);
    *(int *)((long)userData + 800) = *(int *)((long)userData + 800) + 1;
    if (199 < *(int *)((long)userData + 800)) {
      *(int *)((long)userData + 800) = *(int *)((long)userData + 800) + -200;
    }
    *(int *)((long)userData + 0x324) = *(int *)((long)userData + 0x324) + 3;
    if (199 < *(int *)((long)userData + 0x324)) {
      *(int *)((long)userData + 0x324) = *(int *)((long)userData + 0x324) + -200;
    }
  }
  return 0;
}

Assistant:

static int patestCallback( const void *inputBuffer, void *outputBuffer,
                            unsigned long framesPerBuffer,
                            const PaStreamCallbackTimeInfo* timeInfo,
                            PaStreamCallbackFlags statusFlags,
                            void *userData )
{
    paTestData *data = (paTestData*)userData;
    float *out = (float*)outputBuffer;
    unsigned long i;

    (void) timeInfo; /* Prevent unused variable warnings. */
    (void) statusFlags;
    (void) inputBuffer;
    
    for( i=0; i<framesPerBuffer; i++ )
    {
        *out++ = data->sine[data->left_phase];  /* left */
        *out++ = data->sine[data->right_phase];  /* right */
        data->left_phase += 1;
        if( data->left_phase >= TABLE_SIZE ) data->left_phase -= TABLE_SIZE;
        data->right_phase += 3; /* higher pitch so we can distinguish left and right. */
        if( data->right_phase >= TABLE_SIZE ) data->right_phase -= TABLE_SIZE;
    }
    
    return paContinue;
}